

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_to_bitset(roaring_bitmap_t *r,bitset_t *bitset)

{
  ushort uVar1;
  _Bool _Var2;
  uint8_t uVar3;
  uint32_t uVar4;
  ulong newarraysize;
  ulong uVar5;
  array_container_t *src;
  int *piVar6;
  uint64_t *words;
  int i;
  long lVar7;
  int32_t rlepos;
  long lVar8;
  
  uVar4 = roaring_bitmap_maximum(r);
  newarraysize = (ulong)((uVar4 >> 6) + 1);
  _Var2 = bitset_resize(bitset,newarraysize,true);
  if (_Var2) {
    for (lVar7 = 0; lVar7 < (r->high_low_container).size; lVar7 = lVar7 + 1) {
      uVar3 = (r->high_low_container).typecodes[lVar7];
      piVar6 = (int *)(r->high_low_container).containers[lVar7];
      if (uVar3 == '\x04') {
        uVar3 = (uint8_t)piVar6[2];
        piVar6 = *(int **)piVar6;
      }
      uVar1 = (r->high_low_container).keys[lVar7];
      words = bitset->array + (ulong)uVar1 * 0x400;
      if (uVar3 == '\x01') {
        uVar5 = newarraysize + (ulong)uVar1 * -0x400;
        if (0x3ff < uVar5) {
          uVar5 = 0x400;
        }
        memcpy(words,*(void **)(piVar6 + 2),(ulong)(uint)((int)uVar5 << 3));
      }
      else if (uVar3 == '\x02') {
        bitset_set_list(words,*(uint16_t **)(piVar6 + 2),(long)*piVar6);
      }
      else {
        for (lVar8 = 0; lVar8 < *piVar6; lVar8 = lVar8 + 1) {
          bitset_set_lenrange(words,(uint)*(ushort *)(*(long *)(piVar6 + 2) + lVar8 * 4),
                              (uint)*(ushort *)(*(long *)(piVar6 + 2) + 2 + lVar8 * 4));
        }
      }
    }
  }
  return _Var2;
}

Assistant:

bool roaring_bitmap_to_bitset(const roaring_bitmap_t *r, bitset_t *bitset) {
    uint32_t max_value = roaring_bitmap_maximum(r);
    size_t new_array_size = (size_t)(max_value / 64 + 1);
    bool resize_ok = bitset_resize(bitset, new_array_size, true);
    if (!resize_ok) {
        return false;
    }
    const roaring_array_t *ra = &r->high_low_container;
    for (int i = 0; i < ra->size; ++i) {
        uint64_t *words = bitset->array + (ra->keys[i] << 10);
        uint8_t type = ra->typecodes[i];
        const container_t *c = ra->containers[i];
        if (type == SHARED_CONTAINER_TYPE) {
            c = container_unwrap_shared(c, &type);
        }
        switch (type) {
            case BITSET_CONTAINER_TYPE: {
                size_t max_word_index = new_array_size - (ra->keys[i] << 10);
                if (max_word_index > 1024) {
                    max_word_index = 1024;
                }
                const bitset_container_t *src = const_CAST_bitset(c);
                memcpy(words, src->words, max_word_index * sizeof(uint64_t));
            } break;
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *src = const_CAST_array(c);
                bitset_set_list(words, src->array, src->cardinality);
            } break;
            case RUN_CONTAINER_TYPE: {
                const run_container_t *src = const_CAST_run(c);
                for (int32_t rlepos = 0; rlepos < src->n_runs; ++rlepos) {
                    rle16_t rle = src->runs[rlepos];
                    bitset_set_lenrange(words, rle.value, rle.length);
                }
            } break;
            default:
                roaring_unreachable;
        }
    }
    return true;
}